

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

var __thiscall
cs::
make_cni<cs_impl::any(&)(phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>const&,phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>const&)>
          (cs *this,
          _func_any_flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_ptr_flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_ptr
          *func,types type)

{
  cni local_20;
  types local_14;
  
  local_14 = type;
  local_20.mCni =
       cs_impl::cni::
       construct_helper<cs_impl::any(*)(phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>const&,phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>const&)>
       ::
       construct<cs_impl::any(&)(phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>const&,phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>const&)>
                 (func);
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types&>
            ((any *)this,&local_20,&local_14);
  if (local_20.mCni != (cni_holder_base *)0x0) {
    (*(local_20.mCni)->_vptr_cni_holder_base[1])();
  }
  return (var)(proxy *)this;
}

Assistant:

var make_cni(T &&func, callable::types type)
	{
		return var::make_protect<callable>(cni(func), type);
	}